

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Image<float,_gimage::PixelTraits<float>_> * __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::operator=
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  float *__dest;
  float *__src;
  int iVar1;
  undefined4 extraout_var;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  long in_stack_00000018;
  long in_stack_00000020;
  
  getWidth(in_RSI);
  getHeight(in_RSI);
  getDepth(in_RSI);
  setSize(this,(long)a,in_stack_00000020,in_stack_00000018);
  __dest = in_RDI->pixel;
  __src = in_RSI->pixel;
  iVar1 = std::abs((int)in_RDI->n);
  memcpy(__dest,__src,CONCAT44(extraout_var,iVar1) << 2);
  return in_RDI;
}

Assistant:

Image<T> &operator=(const Image<T> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, std::abs(n)*sizeof(T));

      return *this;
    }